

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void basic_suite::test_string_allocator(void)

{
  undefined1 local_1e3;
  undefined1 local_1e2 [2];
  view_type local_1e0;
  basic_string<char,_std::char_traits<char>,_std::scoped_allocator_adaptor<std::allocator<char>_>_>
  local_1c8;
  undefined4 local_19c;
  value local_198 [2];
  undefined4 local_190;
  value local_18c [6];
  undefined4 local_174;
  value local_170 [2];
  basic_string_view<char,_std::char_traits<char>_> local_168;
  undefined1 local_158 [8];
  reader reader;
  char input [8];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x226168706c6122;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_168,
             (char *)&reader.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_158,&local_168);
  local_170[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_174 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xbc,"void basic_suite::test_string_allocator()",local_170,&local_174);
  local_18c[0] = trial::protocol::json::basic_reader<char>::symbol((basic_reader<char> *)local_158);
  local_190 = 6;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::symbol::value,trial::protocol::json::token::symbol::value>
            ("reader.symbol()","token::symbol::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xbd,"void basic_suite::test_string_allocator()",local_18c,&local_190);
  local_198[0] = trial::protocol::json::basic_reader<char>::category
                           ((basic_reader<char> *)local_158);
  local_19c = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::category::value,trial::protocol::json::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xbe,"void basic_suite::test_string_allocator()",local_198,&local_19c);
  trial::protocol::json::basic_reader<char>::
  value<std::__cxx11::basic_string<char,std::char_traits<char>,std::scoped_allocator_adaptor<std::allocator<char>>>>
            (&local_1c8,(basic_reader<char> *)local_158);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::__cxx11::basic_string<char,std::char_traits<char>,std::scoped_allocator_adaptor<std::allocator<char>>>,char[6]>
            ("reader.value<string_type>()","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xc0,"void basic_suite::test_string_allocator()",&local_1c8,"alpha");
  std::__cxx11::
  basic_string<char,_std::char_traits<char>,_std::scoped_allocator_adaptor<std::allocator<char>_>_>
  ::~basic_string(&local_1c8);
  local_1e0 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_158);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[8]>
            ("reader.literal()","\"\\\"alpha\\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xc1,"void basic_suite::test_string_allocator()",&local_1e0,"\"alpha\"");
  local_1e2[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_158);
  local_1e3 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xc2,"void basic_suite::test_string_allocator()",local_1e2,&local_1e3);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_158);
  return;
}

Assistant:

void test_string_allocator()
{
    const char input[] = "\"alpha\"";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    using string_type = std::basic_string<char, std::char_traits<char>, std::scoped_allocator_adaptor<std::allocator<char>>>;
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<string_type>(), "alpha");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "\"alpha\"");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
}